

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::ClipperOffset::DoSquare(ClipperOffset *this,int j,int k)

{
  pointer pDVar1;
  pointer pIVar2;
  double dVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  IntPoint local_38;
  
  pDVar1 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar6 = atan2(this->m_sinA,pDVar1[k].X * pDVar1[j].X + pDVar1[k].Y * pDVar1[j].Y);
  dVar7 = tan(dVar6 * 0.25);
  pIVar2 = (this->m_srcPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar1 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start + k;
  dVar6 = pDVar1->X;
  dVar3 = pDVar1->Y;
  dVar8 = this->m_delta * (-dVar3 * dVar7 + dVar6) + (double)pIVar2[j].X;
  dVar6 = this->m_delta * (dVar6 * dVar7 + dVar3) + (double)pIVar2[j].Y;
  uVar4 = -(ulong)(dVar8 < 0.0);
  uVar5 = -(ulong)(dVar6 < 0.0);
  local_38.X = (cInt)((double)(~uVar4 & 0x3fe0000000000000 | uVar4 & 0xbfe0000000000000) + dVar8);
  local_38.Y = (cInt)((double)(~uVar5 & 0x3fe0000000000000 | uVar5 & 0xbfe0000000000000) + dVar6);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
  emplace_back<ClipperLib::IntPoint>(&this->m_destPoly,&local_38);
  pIVar2 = (this->m_srcPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar1 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start + j;
  dVar6 = pDVar1->X;
  dVar3 = pDVar1->Y;
  dVar8 = this->m_delta * (dVar3 * dVar7 + dVar6) + (double)pIVar2[j].X;
  dVar6 = this->m_delta * (-dVar6 * dVar7 + dVar3) + (double)pIVar2[j].Y;
  uVar4 = -(ulong)(dVar8 < 0.0);
  uVar5 = -(ulong)(dVar6 < 0.0);
  local_38.X = (cInt)((double)(~uVar4 & 0x3fe0000000000000 | uVar4 & 0xbfe0000000000000) + dVar8);
  local_38.Y = (cInt)((double)(~uVar5 & 0x3fe0000000000000 | uVar5 & 0xbfe0000000000000) + dVar6);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
  emplace_back<ClipperLib::IntPoint>(&this->m_destPoly,&local_38);
  return;
}

Assistant:

void ClipperOffset::DoSquare(int j, int k)
{
  double dx = std::tan(std::atan2(m_sinA,
      m_normals[k].X * m_normals[j].X + m_normals[k].Y * m_normals[j].Y) / 4);
  m_destPoly.push_back(IntPoint(
      Round(m_srcPoly[j].X + m_delta * (m_normals[k].X - m_normals[k].Y * dx)),
      Round(m_srcPoly[j].Y + m_delta * (m_normals[k].Y + m_normals[k].X * dx))));
  m_destPoly.push_back(IntPoint(
      Round(m_srcPoly[j].X + m_delta * (m_normals[j].X + m_normals[j].Y * dx)),
      Round(m_srcPoly[j].Y + m_delta * (m_normals[j].Y - m_normals[j].X * dx))));
}